

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O3

gpu_object *
nvrm_find_object_by_func(gpu_object *parent,_func_int_gpu_object_ptr_uint64_t *check,uint64_t ctx)

{
  int iVar1;
  gpu_object *pgVar2;
  long lVar3;
  
  iVar1 = (*check)(parent,ctx);
  if (iVar1 == 0) {
    iVar1 = parent->children_space;
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        if (parent->children_objects[lVar3] != (gpu_object *)0x0) {
          pgVar2 = nvrm_find_object_by_func(parent->children_objects[lVar3],check,ctx);
          if (pgVar2 != (gpu_object *)0x0) {
            return pgVar2;
          }
          iVar1 = parent->children_space;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar1);
    }
    parent = (gpu_object *)0x0;
  }
  return parent;
}

Assistant:

static struct gpu_object *nvrm_find_object_by_func(struct gpu_object *parent,
		int (*check)(struct gpu_object *, uint64_t), uint64_t ctx)
{
	struct gpu_object *ret;
	int i;
	if (check(parent, ctx))
		return parent;

	for (i = 0; i < parent->children_space; ++i)
		if (parent->children_objects[i])
		{
			ret = nvrm_find_object_by_func(parent->children_objects[i], check, ctx);
			if (ret)
				return ret;
		}
	return NULL;
}